

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintableTextTest.cpp
# Opt level: O1

void __thiscall PrintableTextTest::PrintableTextTest(PrintableTextTest *this)

{
  NamedTest *this_00;
  _Head_base<0UL,_oout::PrintableText<bool>_*,_false> local_60;
  shared_ptr<oout::EqualTest> local_58;
  shared_ptr<const_oout::NamedTest> local_48;
  string local_38;
  
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__PrintableTextTest_00198750;
  local_60._M_head_impl = (PrintableText<bool> *)operator_new(0x10);
  ((local_60._M_head_impl)->super_Text)._vptr_Text = (_func_int **)&PTR__Text_00198790;
  (local_60._M_head_impl)->value = true;
  local_58.super___shared_ptr<oout::EqualTest,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::EqualTest,std::allocator<oout::EqualTest>,std::unique_ptr<oout::PrintableText<bool>,std::default_delete<oout::PrintableText<bool>>>,char_const(&)[5]>
            (&local_58.super___shared_ptr<oout::EqualTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (EqualTest **)&local_58,(allocator<oout::EqualTest> *)&local_38,
             (unique_ptr<oout::PrintableText<bool>,_std::default_delete<oout::PrintableText<bool>_>_>
              *)&local_60,(char (*) [5])0x17b979);
  local_48.super___shared_ptr<const_oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::NamedTest_const,std::allocator<oout::NamedTest>,char_const(&)[26],std::shared_ptr<oout::EqualTest>>
            (&local_48.super___shared_ptr<const_oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(NamedTest **)&local_48,(allocator<oout::NamedTest> *)&local_38,
             (char (*) [26])"Boolean represent as text",&local_58);
  this_00 = (NamedTest *)operator_new(0x38);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"PrintableTextTest","");
  oout::NamedTest::NamedTest(this_00,&local_38,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  (this->tests)._M_t.super___uniq_ptr_impl<const_oout::Test,_std::default_delete<const_oout::Test>_>
  ._M_t.super__Tuple_impl<0UL,_const_oout::Test_*,_std::default_delete<const_oout::Test>_>.
  super__Head_base<0UL,_const_oout::Test_*,_false>._M_head_impl = (Test *)this_00;
  if (local_48.super___shared_ptr<const_oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<const_oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_58.super___shared_ptr<oout::EqualTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.super___shared_ptr<oout::EqualTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_60._M_head_impl != (PrintableText<bool> *)0x0) {
    operator_delete(local_60._M_head_impl,0x10);
  }
  return;
}

Assistant:

PrintableTextTest::PrintableTextTest()
	: tests(
		make_unique<NamedTest>(
			"PrintableTextTest",
			make_shared<const NamedTest>(
				"Boolean represent as text",
				make_shared<EqualTest>(
					make_unique<PrintableText<bool>>(
						true
					),
					"true"
				)
			)
		)
	)
{
}